

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O3

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 *puVar10;
  long lVar11;
  
  uVar3 = (this->super_state_base).m_cur_state;
  if (match_dist < 0x1000) {
    uVar5 = (ulong)match_dist;
    puVar10 = CLZBase::m_slot_tab0;
  }
  else if (match_dist < 0x100000) {
    uVar5 = (ulong)(match_dist >> 0xb);
    puVar10 = CLZBase::m_slot_tab1;
  }
  else {
    if (0xffffff < match_dist) {
      if (match_dist < 0x2000000) {
        uVar5 = (ulong)((match_dist - 0x1000000 >> 0x17) + 0x30);
      }
      else if (match_dist < 0x4000000) {
        uVar5 = (ulong)((match_dist + 0xfe000000 >> 0x18) + 0x32);
      }
      else {
        uVar5 = (ulong)((match_dist + 0xfc000000 >> 0x19) + 0x34);
      }
      goto LAB_0010bc25;
    }
    uVar5 = (ulong)(match_dist >> 0x10);
    puVar10 = CLZBase::m_slot_tab2;
  }
  uVar5 = (ulong)(byte)puVar10[uVar5];
LAB_0010bc25:
  lVar4 = (ulong)*(uint *)((long)&g_prob_cost + (ulong)this->m_is_rep_model[uVar3].m_bit_0_prob * 4)
          + (ulong)*(uint *)((long)&g_prob_cost +
                            (ulong)(0x800 - this->m_is_match_model[is_match_model_index].
                                            m_bit_0_prob) * 4);
  bVar2 = *(byte *)((long)&CLZDecompBase::m_lzx_position_extra_bits + uVar5);
  if (bVar2 < 3) {
    lVar4 = lVar4 + (ulong)bVar2 * 0x1000000;
  }
  else {
    uVar7 = (ulong)(uint)((int)uVar5 * 4);
    uVar9 = 0;
    if (4 < bVar2) {
      uVar9 = (ulong)((uint)bVar2 * 0x1000000 + 0xfc000000);
    }
    lVar4 = (ulong)*(byte *)(*(long *)&this->field_0x4f8 +
                            (ulong)(match_dist -
                                    *(int *)((long)&CLZDecompBase::m_lzx_position_base + uVar7) &
                                    *(uint *)((long)&CLZDecompBase::m_lzx_position_extra_mask +
                                             uVar7) & 0xf)) * 0x1000000 + uVar9 + lVar4;
  }
  if (min_len <= max_len) {
    uVar9 = (ulong)min_len;
    uVar8 = min_len - 2;
    do {
      lVar11 = lVar4;
      uVar6 = uVar8;
      if (8 < (long)uVar9) {
        if (uVar9 < 0x102) {
          lVar11 = (ulong)*(byte *)(*(long *)(&this->field_0x3d8 + (uint)(6 < uVar3) * 0x90) + -9 +
                                   uVar9) * 0x1000000 + lVar4;
        }
        else {
          uVar6 = uVar8 - 0x100;
          lVar11 = 9;
          if ((0xff < uVar6) && (lVar11 = 0xc, 0x4ff < uVar6)) {
            lVar11 = (ulong)(0x14ff < uVar6) * 4 + 0xf;
          }
          lVar11 = lVar11 + lVar4 +
                   (ulong)*(byte *)(*(long *)(&this->field_0x3d8 + (uint)(6 < uVar3) * 0x90) + 0xf9)
                   * 0x1000000;
        }
        uVar6 = 7;
      }
      pBitcosts[uVar9] =
           (ulong)*(byte *)(*(long *)&this->field_0x228 + (ulong)((uVar6 | (int)uVar5 * 8 - 8U) + 2)
                           ) * 0x1000000 + lVar11;
      uVar9 = uVar9 + 1;
      iVar1 = uVar8 - max_len;
      uVar8 = uVar8 + 1;
    } while (iVar1 != -2);
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      LZHAM_NOTE_UNUSED(dict_pos);
      LZHAM_ASSERT(min_len >= CLZBase::cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += convert_to_scaled_bitcost(num_extra_bits);
      else
      {
         if (num_extra_bits > 4)
            cost += convert_to_scaled_bitcost(num_extra_bits - 4);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const quasi_adaptive_huffman_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            if (match_len > CLZBase::cMaxMatchLen)
            {
               len_cost += get_huge_match_code_len(match_len) + large_len_table.get_cost((CLZBase::cMaxMatchLen + 1) - 9);
            }
            else
            {
               len_cost += large_len_table.get_cost(match_len - 9);
            }
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }